

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_from_part_neighbor(REF_EDGE ref_edge,REF_INT *from_part,REF_INT node)

{
  int iVar1;
  REF_INT local_3c;
  REF_INT local_38;
  int local_34;
  REF_INT local_2c;
  REF_INT neighbor;
  REF_INT edge;
  REF_INT item;
  REF_INT node_local;
  REF_INT *from_part_local;
  REF_EDGE ref_edge_local;
  
  if ((node < 0) || (ref_edge->adj->nnode <= node)) {
    local_34 = -1;
  }
  else {
    local_34 = ref_edge->adj->first[node];
  }
  neighbor = local_34;
  if (local_34 == -1) {
    local_38 = -1;
  }
  else {
    local_38 = ref_edge->adj->item[local_34].ref;
  }
  local_2c = local_38;
  while( true ) {
    if (neighbor == -1) {
      return 0;
    }
    iVar1 = (ref_edge->e2n[local_2c << 1] + ref_edge->e2n[local_2c * 2 + 1]) - node;
    if (from_part[iVar1] != -1) break;
    neighbor = ref_edge->adj->item[neighbor].next;
    if (neighbor == -1) {
      local_3c = -1;
    }
    else {
      local_3c = ref_edge->adj->item[neighbor].ref;
    }
    local_2c = local_3c;
  }
  from_part[node] = from_part[iVar1];
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_from_part_neighbor(REF_EDGE ref_edge,
                                                        REF_INT *from_part,
                                                        REF_INT node) {
  REF_INT item, edge, neighbor;

  each_edge_having_node(ref_edge, node, item, edge) {
    neighbor = ref_edge_e2n(ref_edge, 0, edge) +
               ref_edge_e2n(ref_edge, 1, edge) - node;
    if (REF_EMPTY != from_part[neighbor]) {
      from_part[node] = from_part[neighbor];
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}